

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPubkey *ext_pubkey,string *child_path,ByteData *finterprint)

{
  ByteData *string_path;
  ulong uVar1;
  Pubkey local_90;
  allocator local_71;
  string local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  ByteData *local_28;
  ByteData *finterprint_local;
  string *child_path_local;
  ExtPubkey *ext_pubkey_local;
  KeyData *this_local;
  
  local_28 = finterprint;
  finterprint_local = (ByteData *)child_path;
  child_path_local = (string *)ext_pubkey;
  ext_pubkey_local = (ExtPubkey *)this;
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_,(ExtPubkey *)child_path_local);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->path_);
  ByteData::ByteData(&this->fingerprint_,local_28);
  uVar1 = ::std::__cxx11::string::empty();
  string_path = finterprint_local;
  if ((uVar1 & 1) == 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_70,"KeyData",&local_71);
    ToArrayFromString(&local_50,(string *)string_path,&local_70,'\0');
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->path_,&local_50);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  ExtPubkey::GetPubkey(&local_90,(ExtPubkey *)child_path_local);
  Pubkey::operator=(&this->pubkey_,&local_90);
  Pubkey::~Pubkey(&local_90);
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPubkey& ext_pubkey, const std::string& child_path,
    const ByteData& finterprint)
    : extpubkey_(ext_pubkey), fingerprint_(finterprint) {
  if (!child_path.empty()) {
    path_ = ToArrayFromString(child_path, "KeyData", 0);
  }
  pubkey_ = ext_pubkey.GetPubkey();
}